

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_font * rf_ttf_font_from_atlas
                    (rf_font *__return_storage_ptr__,int font_size,rf_image atlas,
                    rf_glyph_info *glyph_metrics,rf_int glyphs_count)

{
  rf_mipmaps_image image;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  undefined8 unaff_R14;
  rf_texture2d texture;
  undefined8 local_40;
  undefined8 uStackY_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  __return_storage_ptr__->glyphs = (rf_glyph_info *)0x0;
  __return_storage_ptr__->glyphs_count = 0;
  (__return_storage_ptr__->texture).mipmaps = 0;
  (__return_storage_ptr__->texture).format = 0;
  *(undefined8 *)&(__return_storage_ptr__->texture).valid = 0;
  __return_storage_ptr__->base_size = 0;
  (__return_storage_ptr__->texture).id = 0;
  (__return_storage_ptr__->texture).width = 0;
  (__return_storage_ptr__->texture).height = 0;
  *(undefined8 *)&__return_storage_ptr__->valid = 0;
  image.field_0._4_4_ = in_stack_ffffffffffffffd4;
  image.field_0._0_4_ = in_stack_ffffffffffffffd0;
  image.field_0._8_8_ = unaff_RBX;
  image.field_0._16_8_ = unaff_R12;
  image._24_8_ = unaff_R14;
  rf_load_texture_from_image_with_mipmaps(image);
  if ((char)in_stack_ffffffffffffffd4 == '\x01') {
    __return_storage_ptr__->base_size = font_size;
    (__return_storage_ptr__->texture).id = (undefined4)local_40;
    (__return_storage_ptr__->texture).width = local_40._4_4_;
    (__return_storage_ptr__->texture).height = (undefined4)uStackY_38;
    (__return_storage_ptr__->texture).mipmaps = uStackY_38._4_4_;
    (__return_storage_ptr__->texture).format = in_stack_ffffffffffffffd0;
    (__return_storage_ptr__->texture).valid = (_Bool)(char)in_stack_ffffffffffffffd4;
    *(int3 *)&(__return_storage_ptr__->texture).field_0x15 =
         (int3)((uint)in_stack_ffffffffffffffd4 >> 8);
    __return_storage_ptr__->glyphs = glyph_metrics;
    __return_storage_ptr__->glyphs_count = glyphs_count;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_ttf_font_from_atlas(int font_size, rf_image atlas, rf_glyph_info* glyph_metrics, rf_int glyphs_count)
{
    rf_font result = {0};

    rf_texture2d texture = rf_load_texture_from_image(atlas);

    if (texture.valid)
    {
        result = (rf_font)
        {
            .glyphs = glyph_metrics,
            .glyphs_count = glyphs_count,
            .texture = texture,
            .base_size = font_size,
            .valid = true,
        };
    }

    return result;
}